

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# branch_and_reduce_algorithm.cpp
# Opt level: O3

bool __thiscall branch_and_reduce_algorithm::almost_dominated(branch_and_reduce_algorithm *this)

{
  int iVar1;
  pointer piVar2;
  pointer piVar3;
  pointer pvVar4;
  int *piVar5;
  int *piVar6;
  iterator __position;
  bool bVar7;
  undefined8 in_RAX;
  int *piVar8;
  int iVar9;
  long lVar10;
  ulong uVar11;
  int iVar12;
  long lVar13;
  int *piVar14;
  int vtx;
  undefined8 uStack_38;
  
  if (this->n < 1) {
    bVar7 = false;
  }
  else {
    lVar13 = 0;
    bVar7 = false;
    uStack_38 = in_RAX;
    do {
      piVar2 = (this->x).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (piVar2[lVar13] < 0) {
        iVar12 = (this->used).uid;
        iVar9 = iVar12 + 1;
        (this->used).uid = iVar9;
        piVar3 = (this->used).used.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if (iVar12 < -1) {
          lVar10 = (long)(this->used).used.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish - (long)piVar3;
          if (lVar10 != 0) {
            uVar11 = 0;
            do {
              piVar3[uVar11] = 0;
              uVar11 = uVar11 + 1;
            } while ((uVar11 & 0xffffffff) < (ulong)(lVar10 >> 2));
          }
          (this->used).uid = 1;
          iVar9 = 1;
        }
        piVar3[lVar13] = iVar9;
        pvVar4 = (this->adj).
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        piVar14 = pvVar4[lVar13].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        piVar5 = *(pointer *)
                  ((long)&pvVar4[lVar13].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data + 8);
        piVar8 = piVar14;
        if (piVar14 != piVar5) {
          do {
            if (piVar2[*piVar8] < 0) {
              piVar3[*piVar8] = iVar9;
            }
            piVar8 = piVar8 + 1;
          } while (piVar8 != piVar5);
          for (; piVar14 != piVar5; piVar14 = piVar14 + 1) {
            iVar9 = *piVar14;
            piVar2 = (this->x).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            if (piVar2[iVar9] < 0) {
              uStack_38 = CONCAT44(0xffffffff,(undefined4)uStack_38);
              pvVar4 = (this->adj).
                       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              piVar8 = pvVar4[iVar9].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start;
              piVar6 = *(pointer *)
                        ((long)&pvVar4[iVar9].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data + 8);
              if (piVar8 == piVar6) {
                iVar9 = -1;
              }
              else {
                iVar12 = 0;
                iVar9 = -1;
                do {
                  iVar1 = *piVar8;
                  if ((piVar2[iVar1] < 0) &&
                     ((this->used).used.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[iVar1] != (this->used).uid)) {
                    uStack_38 = CONCAT44(iVar1,(undefined4)uStack_38);
                    if (0 < iVar12) goto LAB_0010c49b;
                    iVar12 = iVar12 + 1;
                    iVar9 = iVar1;
                  }
                  piVar8 = piVar8 + 1;
                } while (piVar8 != piVar6);
              }
              __position._M_current =
                   (this->b_vtcs).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              if (__position._M_current ==
                  (this->b_vtcs).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                          ((vector<int,std::allocator<int>> *)&this->b_vtcs,__position,
                           (int *)((long)&uStack_38 + 4));
              }
              else {
                *__position._M_current = iVar9;
                (this->b_vtcs).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish = __position._M_current + 1;
              }
              bVar7 = true;
            }
LAB_0010c49b:
          }
        }
      }
      lVar13 = lVar13 + 1;
    } while (lVar13 < this->n);
  }
  return bVar7;
}

Assistant:

bool branch_and_reduce_algorithm::almost_dominated()
{
    bool found = false;
    for (int v = 0; v < n; v++)
        if (x[v] < 0)
        {
            used.clear();
            used.add(v);
            for (int u : adj[v])
                if (x[u] < 0)
                    used.add(u);
            for (int u : adj[v])
                if (x[u] < 0)
                {
                    int cnt = 0;
                    int vtx = -1;
                    for (int w : adj[u])
                    {
                        if (x[w] < 0 && !used.get(w))
                        {
                            cnt++;
                            vtx = w;
                        }
                        if (cnt >= 2)
                            goto loop;
                    }
                    found = true;
                    b_vtcs.push_back(vtx);

                loop:;
                }
        }
    return found;
}